

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O0

int Cudd_bddGenDisjDecomp(DdManager *dd,DdNode *f,DdNode ***disjuncts)

{
  int iVar1;
  int local_28;
  int i;
  int result;
  DdNode ***disjuncts_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  iVar1 = Cudd_bddGenConjDecomp(dd,(DdNode *)((ulong)f ^ 1),disjuncts);
  for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
    (*disjuncts)[local_28] = (DdNode *)((ulong)(*disjuncts)[local_28] ^ 1);
  }
  return iVar1;
}

Assistant:

int
Cudd_bddGenDisjDecomp(
  DdManager * dd /* manager */,
  DdNode * f /* function to be decomposed */,
  DdNode *** disjuncts /* address of the array of the disjuncts */)
{
    int result, i;

    result = Cudd_bddGenConjDecomp(dd,Cudd_Not(f),disjuncts);
    for (i = 0; i < result; i++) {
        (*disjuncts)[i] = Cudd_Not((*disjuncts)[i]);
    }
    return(result);

}